

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O0

Expression *
slang::ast::ForeachLoopStatement::buildLoopDims
          (ForeachLoopListSyntax *loopList,ASTContext *context,
          SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *dims)

{
  SourceRange range;
  basic_string_view<char,_std::char_traits<char>_> __y;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view arg;
  string_view arg_00;
  SourceLocation __addr;
  bool bVar1;
  int iVar2;
  NameSyntax *pNVar3;
  undefined4 extraout_var;
  IdentifierNameSyntax *pIVar4;
  Type *pTVar5;
  TempVarSymbol *pTVar6;
  reference pLVar7;
  SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *in_RDX;
  SourceLocation in_RSI;
  long in_RDI;
  IteratorSymbol *it_1;
  Type *indexType;
  string_view name;
  IdentifierNameSyntax *idName_1;
  Type *currType;
  NameSyntax *loopVar_1;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *__range2;
  bool skippedAny;
  Symbol *arraySym;
  Type *type;
  IteratorSymbol *it;
  Token idName;
  NameSyntax *loopVar;
  const_iterator __end3;
  const_iterator __begin3;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *__range3;
  Expression *arrayRef;
  Compilation *comp;
  Compilation *in_stack_fffffffffffffd68;
  IteratorSymbol *in_stack_fffffffffffffd70;
  IteratorSymbol *this;
  SourceLocation in_stack_fffffffffffffd78;
  SourceLocation in_stack_fffffffffffffd80;
  Type *in_stack_fffffffffffffd88;
  SourceLocation in_stack_fffffffffffffd90;
  SourceLocation in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  DiagCode in_stack_fffffffffffffda4;
  Diagnostic *in_stack_fffffffffffffdb0;
  Type *in_stack_fffffffffffffdb8;
  Diagnostic *in_stack_fffffffffffffdc0;
  undefined1 local_148 [16];
  undefined8 local_138;
  SourceRange local_130;
  undefined4 local_11c;
  SyntaxNode *local_118;
  const_iterator local_110;
  const_iterator local_100;
  long local_f0;
  byte local_e1;
  SourceLocation local_e0;
  SourceLocation local_d8;
  undefined4 local_cc;
  Symbol *local_c8;
  Type *local_c0;
  optional<slang::ConstantRange> local_b0;
  IteratorSymbol *local_a0;
  SourceLocation local_98;
  string_view local_90;
  IteratorSymbol *local_80;
  Token local_78;
  SyntaxNode *local_68;
  const_iterator local_60;
  const_iterator local_50;
  long local_40;
  bitmask<slang::ast::ASTFlags> local_38;
  Expression *local_30;
  Compilation *local_28;
  SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *local_20;
  SourceLocation local_18;
  long local_10;
  Expression *local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = ASTContext::getCompilation((ASTContext *)0x86ea2c);
  pNVar3 = not_null<slang::syntax::NameSyntax_*>::operator*
                     ((not_null<slang::syntax::NameSyntax_*> *)0x86ea45);
  __addr = local_18;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_38,None);
  iVar2 = Expression::bind((int)pNVar3,(sockaddr *)__addr,(socklen_t)local_38.m_bits);
  local_30 = (Expression *)CONCAT44(extraout_var,iVar2);
  bVar1 = Expression::bad((Expression *)in_stack_fffffffffffffd70);
  if (bVar1) {
    local_40 = local_10 + 0x40;
    local_50 = slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::begin
                         ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)0x86eabe);
    local_60 = slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::end
                         ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)0x86eadb);
    while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>_>
                             ((self_type *)in_stack_fffffffffffffd70,
                              (iterator_base<const_slang::syntax::NameSyntax_*> *)
                              in_stack_fffffffffffffd68), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_68 = (SyntaxNode *)
                 iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>,_false>
                 ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>,_false>
                              *)0x86eb18);
      if (local_68->kind == IdentifierName) {
        pIVar4 = slang::syntax::SyntaxNode::as<slang::syntax::IdentifierNameSyntax>(local_68);
        local_78.kind = (pIVar4->identifier).kind;
        local_78._2_1_ = (pIVar4->identifier).field_0x2;
        local_78.numFlags.raw = (pIVar4->identifier).numFlags.raw;
        local_78.rawLen = (pIVar4->identifier).rawLen;
        local_78.info = (pIVar4->identifier).info;
        local_90 = parsing::Token::valueText((Token *)in_stack_fffffffffffffd80);
        local_98 = parsing::Token::location(&local_78);
        Compilation::getErrorType(local_28);
        Compilation::getErrorType(local_28);
        local_80 = BumpAllocator::
                   emplace<slang::ast::IteratorSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::Type_const&,slang::ast::Type_const&>
                             ((BumpAllocator *)
                              CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                              (basic_string_view<char,_std::char_traits<char>_> *)
                              in_stack_fffffffffffffd98,(SourceLocation *)in_stack_fffffffffffffd90,
                              in_stack_fffffffffffffd88,(Type *)in_stack_fffffffffffffd80);
        pTVar6 = std::exchange<slang::ast::TempVarSymbol_const*,slang::ast::IteratorSymbol*&>
                           ((TempVarSymbol **)in_stack_fffffffffffffd70,
                            (IteratorSymbol **)in_stack_fffffffffffffd68);
        (local_80->super_TempVarSymbol).nextTemp = pTVar6;
        std::optional<slang::ConstantRange>::optional(&local_b0);
        local_a0 = local_80;
        SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::push_back
                  ((SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *)
                   in_stack_fffffffffffffd70,(LoopDim *)in_stack_fffffffffffffd68);
      }
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>,_false>
                  *)in_stack_fffffffffffffd70);
    }
    local_8 = (Expression *)0x0;
  }
  else {
    local_c0 = not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0x86ec7e);
    local_c8 = Expression::getSymbolReference
                         ((Expression *)in_stack_fffffffffffffdb8,
                          SUB81((ulong)in_stack_fffffffffffffdb0 >> 0x38,0));
    if ((local_c8 == (Symbol *)0x0) ||
       (bVar1 = Type::isIterable((Type *)in_stack_fffffffffffffd70), !bVar1)) {
      local_cc = 0x300008;
      local_e0 = (local_30->sourceRange).startLoc;
      local_d8 = (local_30->sourceRange).endLoc;
      sourceRange.endLoc = in_stack_fffffffffffffd98;
      sourceRange.startLoc = in_stack_fffffffffffffd90;
      ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffd88,in_stack_fffffffffffffda4,
                          sourceRange);
      local_8 = (Expression *)0x0;
    }
    else {
      local_e1 = 0;
      local_f0 = local_10 + 0x40;
      local_100 = slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::begin
                            ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)0x86ed47);
      local_110 = slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::end
                            ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)0x86ed64);
      while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>_>
                               ((self_type *)in_stack_fffffffffffffd70,
                                (iterator_base<const_slang::syntax::NameSyntax_*> *)
                                in_stack_fffffffffffffd68), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_118 = (SyntaxNode *)
                    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>,_false>
                    ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>,_false>
                                 *)0x86eda1);
        if ((local_c0 == (Type *)0x0) || (bVar1 = Type::isScalar((Type *)0x86edc1), bVar1)) {
          local_11c = 0x4e0008;
          local_130 = slang::syntax::SyntaxNode::sourceRange
                                ((SyntaxNode *)in_stack_fffffffffffffdc0);
          sourceRange_00.endLoc = in_stack_fffffffffffffd98;
          sourceRange_00.startLoc = in_stack_fffffffffffffd90;
          ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffd88,in_stack_fffffffffffffda4,
                              sourceRange_00);
          not_null<const_slang::ast::Type_*>::operator*
                    ((not_null<const_slang::ast::Type_*> *)0x86ee40);
          ast::operator<<(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
          return (Expression *)0x0;
        }
        bVar1 = Type::hasFixedRange((Type *)in_stack_fffffffffffffd70);
        if (bVar1) {
          in_stack_fffffffffffffda0 = SUB84(local_20,0);
          in_stack_fffffffffffffda4 = SUB84((ulong)local_20 >> 0x20,0);
          in_stack_fffffffffffffd98 = (SourceLocation)local_148;
          Type::getFixedRange((Type *)in_stack_fffffffffffffd68);
          std::optional<slang::ConstantRange>::optional<slang::ConstantRange,_true>
                    ((optional<slang::ConstantRange> *)in_stack_fffffffffffffd70,
                     (ConstantRange *)in_stack_fffffffffffffd68);
          local_138 = 0;
          SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::push_back
                    ((SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *)
                     in_stack_fffffffffffffd70,(LoopDim *)in_stack_fffffffffffffd68);
          this = in_stack_fffffffffffffd70;
        }
        else {
          SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::emplace_back<>
                    ((SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *)
                     in_stack_fffffffffffffd78);
          this = in_stack_fffffffffffffd70;
        }
        local_c0 = Type::getArrayElementType((Type *)in_stack_fffffffffffffd78);
        if (local_118->kind == EmptyIdentifierName) {
          local_e1 = 1;
          in_stack_fffffffffffffd70 = this;
        }
        else {
          pIVar4 = slang::syntax::SyntaxNode::as<slang::syntax::IdentifierNameSyntax>(local_118);
          parsing::Token::valueText((Token *)in_stack_fffffffffffffd80);
          SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::back(local_20);
          bVar1 = std::optional::operator_cast_to_bool((optional<slang::ConstantRange> *)0x86ef6c);
          if ((!bVar1) && ((local_e1 & 1) != 0)) {
            slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffdc0);
            sourceRange_01.endLoc = in_stack_fffffffffffffd98;
            sourceRange_01.startLoc = local_18;
            ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffd88,in_stack_fffffffffffffda4,
                                sourceRange_01);
            arg._M_str = (char *)in_stack_fffffffffffffdc0;
            arg._M_len = (size_t)in_stack_fffffffffffffdb8;
            Diagnostic::operator<<(in_stack_fffffffffffffdb0,arg);
            return (Expression *)0x0;
          }
          __x._M_str._0_4_ = in_stack_fffffffffffffda0;
          __x._M_len = (size_t)in_stack_fffffffffffffd98;
          __x._M_str._4_4_ = in_stack_fffffffffffffda4;
          __y._M_str = (char *)in_stack_fffffffffffffd90;
          __y._M_len = (size_t)in_stack_fffffffffffffd88;
          bVar1 = std::operator==(__x,__y);
          if (bVar1) {
            slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffdc0);
            sourceRange_02.endLoc = in_stack_fffffffffffffd98;
            sourceRange_02.startLoc = in_stack_fffffffffffffd90;
            ASTContext::addDiag((ASTContext *)local_18,in_stack_fffffffffffffda4,sourceRange_02);
            arg_00._M_str = (char *)in_stack_fffffffffffffdc0;
            arg_00._M_len = (size_t)in_stack_fffffffffffffdb8;
            Diagnostic::operator<<(in_stack_fffffffffffffdb0,arg_00);
            return (Expression *)0x0;
          }
          bVar1 = Type::isAssociativeArray((Type *)0x86f13f);
          if (bVar1) {
            pTVar5 = Type::getAssociativeIndexType((Type *)in_stack_fffffffffffffd68);
            if (pTVar5 == (Type *)0x0) {
              in_stack_fffffffffffffd78 = local_18;
              slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffdc0);
              sourceRange_03.endLoc = in_stack_fffffffffffffd98;
              sourceRange_03.startLoc = in_stack_fffffffffffffd90;
              in_stack_fffffffffffffd80 =
                   (SourceLocation)
                   ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffd88,
                                       in_stack_fffffffffffffda4,sourceRange_03);
              not_null<slang::syntax::NameSyntax_*>::operator->
                        ((not_null<slang::syntax::NameSyntax_*> *)0x86f1da);
              slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffdc0);
              range.endLoc = in_stack_fffffffffffffd80;
              range.startLoc = in_stack_fffffffffffffd78;
              Diagnostic::operator<<((Diagnostic *)this,range);
              Compilation::getErrorType(local_28);
            }
          }
          else {
            Compilation::getIntType(local_28);
          }
          in_stack_fffffffffffffd68 = local_28;
          parsing::Token::location(&pIVar4->identifier);
          in_stack_fffffffffffffd70 =
               BumpAllocator::
               emplace<slang::ast::IteratorSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation,slang::ast::Type_const&,slang::ast::Type_const&>
                         ((BumpAllocator *)
                          CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                          (basic_string_view<char,_std::char_traits<char>_> *)
                          in_stack_fffffffffffffd98,(SourceLocation *)in_stack_fffffffffffffd90,
                          in_stack_fffffffffffffd88,(Type *)in_stack_fffffffffffffd80);
          pTVar6 = std::exchange<slang::ast::TempVarSymbol_const*,slang::ast::IteratorSymbol*&>
                             ((TempVarSymbol **)this,(IteratorSymbol **)in_stack_fffffffffffffd68);
          (in_stack_fffffffffffffd70->super_TempVarSymbol).nextTemp = pTVar6;
          pLVar7 = SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::back(local_20);
          pLVar7->loopVar = in_stack_fffffffffffffd70;
        }
        iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>,_false>
        ::
        operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>_>
                  ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>,_false>
                    *)in_stack_fffffffffffffd70);
      }
      local_8 = local_30;
    }
  }
  return local_8;
}

Assistant:

const Expression* ForeachLoopStatement::buildLoopDims(const ForeachLoopListSyntax& loopList,
                                                      ASTContext& context,
                                                      SmallVectorBase<LoopDim>& dims) {
    // Find the array over which we are looping. Make sure it's actually iterable:
    // - Must be a referenceable variable, class property, etc.
    // - Type can be:
    //    - Any kind of array
    //    - Any multi-dimensional integral type
    //    - A string
    auto& comp = context.getCompilation();
    auto& arrayRef = Expression::bind(*loopList.arrayName, context);
    if (arrayRef.bad()) {
        // Create placeholder iterator symbols to prevent downstream errors.
        for (auto loopVar : loopList.loopVariables) {
            if (loopVar->kind == SyntaxKind::IdentifierName) {
                auto idName = loopVar->as<IdentifierNameSyntax>().identifier;
                auto it = comp.emplace<IteratorSymbol>(idName.valueText(), idName.location(),
                                                       comp.getErrorType(), comp.getErrorType());
                it->nextTemp = std::exchange(context.firstTempVar, it);
                dims.push_back({std::nullopt, it});
            }
        }
        return nullptr;
    }

    const Type* type = arrayRef.type;
    auto arraySym = arrayRef.getSymbolReference();
    if (!arraySym || !type->isIterable()) {
        context.addDiag(diag::NotAnArray, arrayRef.sourceRange);
        return nullptr;
    }

    // Build iterator symbols for each loop variable.
    bool skippedAny = false;
    for (auto loopVar : loopList.loopVariables) {
        // If type is null, we've run out of dimensions so there were too many
        // loop variables supplied.
        if (!type || type->isScalar()) {
            context.addDiag(diag::TooManyForeachVars, loopList.loopVariables.sourceRange())
                << *arrayRef.type;
            return nullptr;
        }

        if (type->hasFixedRange())
            dims.push_back({type->getFixedRange()});
        else
            dims.emplace_back();

        const Type& currType = *type;
        type = type->getArrayElementType();

        // Empty iterator names indicate that we skip this dimension.
        if (loopVar->kind == SyntaxKind::EmptyIdentifierName) {
            skippedAny = true;
            continue;
        }

        auto& idName = loopVar->as<IdentifierNameSyntax>();
        std::string_view name = idName.identifier.valueText();

        // If we previously had skipped dimensions this one can't be dynamically
        // sized (there would be no way to reach it during iteration).
        if (!dims.back().range && skippedAny) {
            context.addDiag(diag::ForeachDynamicDimAfterSkipped, idName.sourceRange()) << name;
            return nullptr;
        }

        if (name == arraySym->name) {
            context.addDiag(diag::LoopVarShadowsArray, loopVar->sourceRange()) << name;
            return nullptr;
        }

        // The type of the iterator is typically an int, unless this dimension
        // is an associative array in which case it's the index type.
        const Type* indexType;
        if (currType.isAssociativeArray()) {
            indexType = currType.getAssociativeIndexType();
            if (!indexType) {
                context.addDiag(diag::ForeachWildcardIndex, loopVar->sourceRange())
                    << loopList.arrayName->sourceRange();
                indexType = &comp.getErrorType();
            }
        }
        else {
            indexType = &comp.getIntType();
        }

        // Build the iterator variable and hook it up to our new context's
        // linked list of iterators.
        auto it = comp.emplace<IteratorSymbol>(name, idName.identifier.location(), currType,
                                               *indexType);
        it->nextTemp = std::exchange(context.firstTempVar, it);
        dims.back().loopVar = it;
    }

    return &arrayRef;
}